

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

void ft_stroke_border_close(SW_FT_StrokeBorder border,SW_FT_Bool reverse)

{
  SW_FT_Byte SVar1;
  uint uVar2;
  uint uVar3;
  SW_FT_Vector *pSVar4;
  SW_FT_Vector *pSVar5;
  SW_FT_Pos SVar6;
  SW_FT_Pos SVar7;
  uint uVar8;
  SW_FT_Byte tmp_1;
  SW_FT_Byte *tag2;
  SW_FT_Byte *tag1;
  SW_FT_Vector tmp;
  SW_FT_Vector *vec2;
  SW_FT_Vector *vec1;
  SW_FT_UInt count;
  SW_FT_UInt start;
  SW_FT_Bool reverse_local;
  SW_FT_StrokeBorder border_local;
  
  uVar2 = border->start;
  uVar3 = border->num_points;
  if (uVar2 + 1 < uVar3) {
    uVar8 = uVar3 - 1;
    border->num_points = uVar8;
    pSVar4 = border->points;
    pSVar5 = border->points;
    pSVar5[uVar2].x = pSVar4[uVar8].x;
    pSVar5[uVar2].y = pSVar4[uVar8].y;
    if (reverse != '\0') {
      pSVar4 = border->points + uVar8;
      pSVar5 = border->points + uVar2;
      while( true ) {
        vec1 = pSVar5 + 1;
        vec2 = pSVar4 + -1;
        if (vec2 <= vec1) break;
        SVar6 = vec1->x;
        SVar7 = pSVar5[1].y;
        vec1->x = vec2->x;
        pSVar5[1].y = pSVar4[-1].y;
        vec2->x = SVar6;
        pSVar4[-1].y = SVar7;
        pSVar4 = vec2;
        pSVar5 = vec1;
      }
      tag1 = border->tags + uVar2;
      tag2 = border->tags + uVar8;
      while( true ) {
        tag1 = tag1 + 1;
        tag2 = tag2 + -1;
        if (tag2 <= tag1) break;
        SVar1 = *tag1;
        *tag1 = *tag2;
        *tag2 = SVar1;
      }
    }
    border->tags[uVar2] = border->tags[uVar2] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar2;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void ft_stroke_border_close(SW_FT_StrokeBorder border,
                                   SW_FT_Bool         reverse)
{
    SW_FT_UInt start = border->start;
    SW_FT_UInt count = border->num_points;

    assert(border->start >= 0);

    /* don't record empty paths! */
    if (count <= start + 1U)
        border->num_points = start;
    else {
        /* copy the last point to the start of this sub-path, since */
        /* it contains the `adjusted' starting coordinates          */
        border->num_points = --count;
        border->points[start] = border->points[count];

        if (reverse) {
            /* reverse the points */
            {
                SW_FT_Vector* vec1 = border->points + start + 1;
                SW_FT_Vector* vec2 = border->points + count - 1;

                for (; vec1 < vec2; vec1++, vec2--) {
                    SW_FT_Vector tmp;

                    tmp = *vec1;
                    *vec1 = *vec2;
                    *vec2 = tmp;
                }
            }

            /* then the tags */
            {
                SW_FT_Byte* tag1 = border->tags + start + 1;
                SW_FT_Byte* tag2 = border->tags + count - 1;

                for (; tag1 < tag2; tag1++, tag2--) {
                    SW_FT_Byte tmp;

                    tmp = *tag1;
                    *tag1 = *tag2;
                    *tag2 = tmp;
                }
            }
        }

        border->tags[start] |= SW_FT_STROKE_TAG_BEGIN;
        border->tags[count - 1] |= SW_FT_STROKE_TAG_END;
    }

    border->start = -1;
    border->movable = FALSE;
}